

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O3

bool __thiscall CEditor::PopupEvent(CEditor *this,void *pContext,CUIRect View)

{
  int iVar1;
  char *pText;
  bool bVar2;
  long in_FS_OFFSET;
  CUIRect ButtonBar;
  CUIRect Label;
  CUIRect local_58;
  CUIRect local_48;
  CUIRect local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = View;
  CUIRect::HSplitTop(&local_38,10.0,(CUIRect *)0x0,&local_38);
  CUIRect::HSplitTop(&local_38,30.0,&local_48,&local_38);
  if ((ulong)(uint)this->m_PopupEventType < 5) {
    CUI::DoLabel(&this->m_UI,&local_48,
                 &DAT_001dee74 + *(int *)(&DAT_001dee74 + (ulong)(uint)this->m_PopupEventType * 4),
                 20.0,1,-1.0,true);
  }
  CUIRect::HSplitBottom(&local_38,10.0,&local_38,(CUIRect *)0x0);
  CUIRect::HSplitBottom(&local_38,20.0,&local_38,&local_58);
  CUIRect::HSplitTop(&local_38,30.0,(CUIRect *)0x0,&local_38);
  CUIRect::VMargin(&local_38,40.0,&local_38);
  CUIRect::HSplitTop(&local_38,20.0,&local_48,&local_38);
  switch(this->m_PopupEventType) {
  case 0:
    pText = 
    "The map contains unsaved data, you might want to save it before you exit the editor.\nContinue anyway?"
    ;
    break;
  case 1:
    pText = 
    "The map contains unsaved data, you might want to save it before you load a new map.\nContinue anyway?"
    ;
    break;
  case 2:
    pText = 
    "The map contains unsaved data, you might want to save it before you load the current map.\nContinue anyway?"
    ;
    break;
  case 3:
    pText = 
    "The map contains unsaved data, you might want to save it before you create a new map.\nContinue anyway?"
    ;
    break;
  case 4:
    pText = "The file already exists.\nDo you want to overwrite the map?";
    local_48.w = -1.0;
    goto LAB_001aa5b9;
  default:
    goto switchD_001aa512_default;
  }
  local_48.w = local_48.w + -10.0;
LAB_001aa5b9:
  CUI::DoLabel(&this->m_UI,&local_48,pText,10.0,0,local_48.w,true);
switchD_001aa512_default:
  CUIRect::VSplitLeft(&local_58,30.0,(CUIRect *)0x0,&local_58);
  CUIRect::VSplitLeft(&local_58,110.0,&local_48,&local_58);
  iVar1 = DoButton_Editor(this,&PopupEvent::s_OkButton,"Ok",0,&local_48,0,(char *)0x0);
  if (iVar1 == 0) {
    bVar2 = false;
    CUIRect::VSplitRight(&local_58,30.0,&local_58,(CUIRect *)0x0);
    CUIRect::VSplitRight(&local_58,110.0,&local_58,&local_48);
    iVar1 = DoButton_Editor(this,&PopupEvent::s_AbortButton,"Abort",0,&local_48,0,(char *)0x0);
    if (iVar1 == 0) goto LAB_001aa740;
  }
  else {
    switch(this->m_PopupEventType) {
    case 0:
      this->m_pConfig->m_ClEditor = 0;
      break;
    case 1:
      InvokeFileDialog(this,-1,0,"Load map","Load","maps","",CallbackOpenMap,this);
      break;
    case 2:
      LoadCurrentMap(this);
      break;
    case 3:
      Reset(this,true);
      this->m_aFileName[0] = '\0';
      break;
    case 4:
      CallbackSaveMap(this->m_aFileSaveName,0,this);
    }
  }
  this->m_PopupEventWasActivated = 0;
  bVar2 = true;
LAB_001aa740:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool CEditor::PopupEvent(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CUIRect Label, ButtonBar;

	// title
	View.HSplitTop(10.0f, 0, &View);
	View.HSplitTop(30.0f, &Label, &View);
	if(pEditor->m_PopupEventType == POPEVENT_EXIT)
		pEditor->UI()->DoLabel(&Label, "Exit the editor", 20.0f, TEXTALIGN_CENTER);
	else if(pEditor->m_PopupEventType == POPEVENT_LOAD)
		pEditor->UI()->DoLabel(&Label, "Load map", 20.0f, TEXTALIGN_CENTER);
	else if(pEditor->m_PopupEventType == POPEVENT_LOAD_CURRENT)
		pEditor->UI()->DoLabel(&Label, "Load current map", 20.0f, TEXTALIGN_CENTER);
	else if(pEditor->m_PopupEventType == POPEVENT_NEW)
		pEditor->UI()->DoLabel(&Label, "New map", 20.0f, TEXTALIGN_CENTER);
	else if(pEditor->m_PopupEventType == POPEVENT_SAVE)
		pEditor->UI()->DoLabel(&Label, "Save map", 20.0f, TEXTALIGN_CENTER);

	View.HSplitBottom(10.0f, &View, 0);
	View.HSplitBottom(20.0f, &View, &ButtonBar);

	// notification text
	View.HSplitTop(30.0f, 0, &View);
	View.VMargin(40.0f, &View);
	View.HSplitTop(20.0f, &Label, &View);
	if(pEditor->m_PopupEventType == POPEVENT_EXIT)
		pEditor->UI()->DoLabel(&Label, "The map contains unsaved data, you might want to save it before you exit the editor.\nContinue anyway?", 10.0f, TEXTALIGN_LEFT, Label.w-10.0f);
	else if(pEditor->m_PopupEventType == POPEVENT_LOAD)
		pEditor->UI()->DoLabel(&Label, "The map contains unsaved data, you might want to save it before you load a new map.\nContinue anyway?", 10.0f, TEXTALIGN_LEFT, Label.w-10.0f);
	else if(pEditor->m_PopupEventType == POPEVENT_LOAD_CURRENT)
		pEditor->UI()->DoLabel(&Label, "The map contains unsaved data, you might want to save it before you load the current map.\nContinue anyway?", 10.0f, TEXTALIGN_LEFT, Label.w-10.0f);
	else if(pEditor->m_PopupEventType == POPEVENT_NEW)
		pEditor->UI()->DoLabel(&Label, "The map contains unsaved data, you might want to save it before you create a new map.\nContinue anyway?", 10.0f, TEXTALIGN_LEFT, Label.w-10.0f);
	else if(pEditor->m_PopupEventType == POPEVENT_SAVE)
		pEditor->UI()->DoLabel(&Label, "The file already exists.\nDo you want to overwrite the map?", 10.0f, TEXTALIGN_LEFT);

	// button bar
	ButtonBar.VSplitLeft(30.0f, 0, &ButtonBar);
	ButtonBar.VSplitLeft(110.0f, &Label, &ButtonBar);
	static int s_OkButton = 0;
	if(pEditor->DoButton_Editor(&s_OkButton, "Ok", 0, &Label, 0, 0))
	{
		if(pEditor->m_PopupEventType == POPEVENT_EXIT)
			pEditor->Config()->m_ClEditor = 0;
		else if(pEditor->m_PopupEventType == POPEVENT_LOAD)
			pEditor->InvokeFileDialog(IStorage::TYPE_ALL, FILETYPE_MAP, "Load map", "Load", "maps", "", pEditor->CallbackOpenMap, pEditor);
		else if(pEditor->m_PopupEventType == POPEVENT_LOAD_CURRENT)
			pEditor->LoadCurrentMap();
		else if(pEditor->m_PopupEventType == POPEVENT_NEW)
		{
			pEditor->Reset();
			pEditor->m_aFileName[0] = 0;
		}
		else if(pEditor->m_PopupEventType == POPEVENT_SAVE)
			pEditor->CallbackSaveMap(pEditor->m_aFileSaveName, IStorage::TYPE_SAVE, pEditor);
		pEditor->m_PopupEventWasActivated = false;
		return true;
	}
	ButtonBar.VSplitRight(30.0f, &ButtonBar, 0);
	ButtonBar.VSplitRight(110.0f, &ButtonBar, &Label);
	static int s_AbortButton = 0;
	if(pEditor->DoButton_Editor(&s_AbortButton, "Abort", 0, &Label, 0, 0))
	{
		pEditor->m_PopupEventWasActivated = false;
		return true;
	}

	return false;
}